

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void Bpgetrast(char *fn,float *bf,int sx,int sy,int r)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  uchar c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  iVar1 = open(fn,0);
  if (iVar1 < 1) {
    iVar1 = 6;
LAB_001028b4:
    error(iVar1);
  }
  if (sx < 1) {
    sx = 0;
  }
  local_40 = (ulong)(uint)sy;
  if (sy < 1) {
    local_40 = 0;
  }
  local_48 = (long)r << 2;
  local_38 = 0;
  do {
    if (local_38 == local_40) {
      close(iVar1);
      return;
    }
    for (uVar3 = 0; (uint)sx != uVar3; uVar3 = uVar3 + 1) {
      sVar2 = read(iVar1,&c,1);
      if (sVar2 != 1) {
        iVar1 = 4;
        goto LAB_001028b4;
      }
      bf[uVar3] = (float)c;
    }
    local_38 = local_38 + 1;
    bf = (float *)((long)bf + local_48);
  } while( true );
}

Assistant:

void Bpgetrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        if (read(fd,&c,sizeof(c)) != 1) {
          error(4) ;
        }
        bf[r*i + j] = (float)c ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}